

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

void P_TossItem(AActor *item)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = sv_dropstyle.Value;
  if (sv_dropstyle.Value == 0) {
    iVar3 = gameinfo.defaultdropstyle;
  }
  uVar1 = FRandom::GenRand32(&pr_dropitem);
  uVar2 = FRandom::GenRand32(&pr_dropitem);
  if (iVar3 == 2) {
    (item->Vel).X = (double)(int)((uVar1 & 7) - (uVar2 & 7)) + (item->Vel).X;
    uVar1 = FRandom::GenRand32(&pr_dropitem);
    uVar2 = FRandom::GenRand32(&pr_dropitem);
    (item->Vel).Y = (double)(int)((uVar1 & 7) - (uVar2 & 7)) + (item->Vel).Y;
  }
  else {
    (item->Vel).X = (double)(int)((uVar1 & 0xff) - (uVar2 & 0xff)) * 0.00390625 + (item->Vel).X;
    uVar1 = FRandom::GenRand32(&pr_dropitem);
    uVar2 = FRandom::GenRand32(&pr_dropitem);
    (item->Vel).Y = (double)(int)((uVar1 & 0xff) - (uVar2 & 0xff)) * 0.00390625 + (item->Vel).Y;
    uVar1 = FRandom::GenRand32(&pr_dropitem);
    (item->Vel).Z = (double)(uVar1 & 0xff) * 0.015625 + 5.0;
  }
  return;
}

Assistant:

void P_TossItem (AActor *item)
{
	int style = sv_dropstyle;
	if (style==0) style = gameinfo.defaultdropstyle;
	
	if (style==2)
	{
		item->Vel.X += pr_dropitem.Random2(7);
		item->Vel.Y += pr_dropitem.Random2(7);
	}
	else
	{
		item->Vel.X += pr_dropitem.Random2() / 256.;
		item->Vel.Y += pr_dropitem.Random2() / 256.;
		item->Vel.Z = 5. + pr_dropitem() / 64.;
	}
}